

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

void Pdr_ManPrintProgress(Pdr_Man_t *p,int fClose,abctime Time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  int local_34;
  int LengthStart;
  int Length;
  int ThisSize;
  int i;
  Vec_Ptr_t *vVec;
  abctime Time_local;
  int fClose_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vSolvers);
  if ((1 < iVar1) && ((iVar1 = Abc_FrameIsBatchMode(), iVar1 == 0 || (fClose != 0)))) {
    local_34 = 0;
    for (Length = 0; iVar1 = Vec_VecSize(p->vClauses), Length < iVar1; Length = Length + 1) {
      pVVar5 = Vec_VecEntry(p->vClauses,Length);
      iVar1 = Vec_PtrSize(pVVar5);
      iVar1 = Abc_Base10Log(iVar1 + 1);
      local_34 = iVar1 + 1 + local_34;
    }
    iVar1 = Abc_MaxInt(0,local_34 + -0x3c);
    iVar2 = Vec_PtrSize(p->vSolvers);
    Abc_Print(1,"%3d :",(ulong)(iVar2 - 1));
    LengthStart = 5;
    if (0 < iVar1) {
      Abc_Print(1," ...");
      LengthStart = 9;
    }
    local_34 = 0;
    for (Length = 0; iVar2 = Vec_VecSize(p->vClauses), Length < iVar2; Length = Length + 1) {
      pVVar5 = Vec_VecEntry(p->vClauses,Length);
      if (local_34 < iVar1) {
        iVar2 = Vec_PtrSize(pVVar5);
        iVar3 = Abc_Base10Log(iVar2 + 1);
      }
      else {
        uVar4 = Vec_PtrSize(pVVar5);
        Abc_Print(1," %d",(ulong)uVar4);
        iVar2 = Vec_PtrSize(pVVar5);
        iVar3 = Abc_Base10Log(iVar2 + 1);
        iVar2 = Vec_PtrSize(pVVar5);
        iVar2 = Abc_Base10Log(iVar2 + 1);
        LengthStart = iVar2 + 1 + LengthStart;
      }
      local_34 = iVar3 + 1 + local_34;
    }
    for (Length = LengthStart; Length < 0x46; Length = Length + 1) {
      Abc_Print(1," ");
    }
    Abc_Print(1,"%6d",(ulong)(uint)p->nQueMax);
    Abc_Print(1,"%10.2f sec",((double)Time * 1.0) / 1000000.0);
    if (p->pPars->fSolveAll != 0) {
      Abc_Print(1,"  CEX =%4d",(ulong)(uint)p->pPars->nFailOuts);
    }
    if (p->pPars->nTimeOutOne != 0) {
      Abc_Print(1,"  T/O =%3d",(ulong)(uint)p->pPars->nDropOuts);
    }
    pcVar6 = "\r";
    if (fClose != 0) {
      pcVar6 = "\n";
    }
    Abc_Print(1,"%s",pcVar6);
    if (fClose != 0) {
      p->nQueMax = 0;
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Pdr_ManPrintProgress( Pdr_Man_t * p, int fClose, abctime Time )
{
    Vec_Ptr_t * vVec;
    int i, ThisSize, Length, LengthStart;
    if ( Vec_PtrSize(p->vSolvers) < 2 )
        return;
    if ( Abc_FrameIsBatchMode() && !fClose )
        return;
    // count the total length of the printout
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    // determine the starting point
    LengthStart = Abc_MaxInt( 0, Length - 60 );
    Abc_Print( 1, "%3d :", Vec_PtrSize(p->vSolvers)-1 );
    ThisSize = 5;
    if ( LengthStart > 0 )
    {
        Abc_Print( 1, " ..." );
        ThisSize += 4;
    }
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
    {
        if ( Length < LengthStart )
        {
            Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
            continue;
        }
        Abc_Print( 1, " %d", Vec_PtrSize(vVec) );
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
        ThisSize += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    }
    for ( i = ThisSize; i < 70; i++ )
        Abc_Print( 1, " " );
    Abc_Print( 1, "%6d", p->nQueMax );
    Abc_Print( 1, "%10.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    if ( p->pPars->fSolveAll )
        Abc_Print( 1, "  CEX =%4d", p->pPars->nFailOuts );
    if ( p->pPars->nTimeOutOne )
        Abc_Print( 1, "  T/O =%3d", p->pPars->nDropOuts );
    Abc_Print( 1, "%s", fClose ? "\n":"\r" );
    if ( fClose )
        p->nQueMax = 0;
    fflush( stdout );
}